

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

UINT8 ym2608_read(void *chip,UINT8 a)

{
  byte bVar1;
  byte local_22;
  UINT8 ret;
  UINT8 addr;
  YM2608 *F2608;
  UINT8 a_local;
  void *chip_local;
  
  bVar1 = *(byte *)((long)chip + 0x22c);
  local_22 = 0;
  switch(a & 3) {
  case 0:
    local_22 = *(byte *)((long)chip + 0x22f) & 0x83;
    break;
  case 1:
    if (bVar1 < 0x10) {
      local_22 = (**(code **)((long)chip + 0x668))(*(undefined8 *)((long)chip + 0x678),0);
    }
    else {
      local_22 = bVar1 == 0xff;
    }
    break;
  case 2:
    local_22 = *(byte *)((long)chip + 0x22f) & (*(byte *)((long)chip + 0x54c9) | 0x80) |
               (*(byte *)((long)chip + 0x54b3) & 1) << 5;
    break;
  case 3:
    if (bVar1 == 8) {
      local_22 = YM_DELTAT_ADPCM_Read((YM_DELTAT *)((long)chip + 0x5430));
    }
    else if (bVar1 == 0xf) {
      local_22 = 0x80;
    }
  }
  return local_22;
}

Assistant:

UINT8 ym2608_read(void *chip,UINT8 a)
{
	YM2608 *F2608 = (YM2608 *)chip;
	UINT8 addr = F2608->OPN.ST.address;
	UINT8 ret = 0;

	switch( a&3 )
	{
	case 0: /* status 0 : YM2203 compatible */
		/* BUSY:x:x:x:x:x:FLAGB:FLAGA */
		ret = FM_STATUS_FLAG(&F2608->OPN.ST) & 0x83;
		break;

	case 1: /* status 0, ID  */
		if( addr < 16 ) ret = F2608->OPN.ST.SSG_funcs.read(F2608->OPN.ST.SSG_param, 0);
		else if(addr == 0xff) ret = 0x01; /* ID code */
		break;

	case 2: /* status 1 : status 0 + ADPCM status */
		/* BUSY : x : PCMBUSY : ZERO : BRDY : EOS : FLAGB : FLAGA */
		ret = (FM_STATUS_FLAG(&F2608->OPN.ST) & (F2608->flagmask|0x80)) | ((F2608->deltaT.PCM_BSY & 1)<<5) ;
		break;

	case 3:
		if(addr == 0x08)
		{
			ret = YM_DELTAT_ADPCM_Read(&F2608->deltaT);
		}
		else if(addr == 0x0f)
		{
			logerror("YM2608 A/D conversion is accessed but not implemented !\n");
			ret = 0x80; /* 2's complement PCM data - result from A/D conversion */
		}
		break;
	}
	return ret;
}